

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastEqBoolInt(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  OpndKind OVar7;
  bool bVar8;
  uint uVar9;
  int32 iVar10;
  undefined4 *puVar11;
  LabelInstr *pLVar12;
  undefined7 uVar21;
  BranchInstr *pBVar14;
  Opnd *pOVar15;
  RegOpnd *pRVar16;
  IntConstOpnd *pIVar17;
  Opnd *pOVar18;
  LabelInstr *pLVar19;
  LabelInstr *pLVar20;
  int iVar22;
  Func *pFVar23;
  OpCode OVar24;
  Var aValue;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar25;
  char *this_00;
  Lowerer *this_01;
  LibraryValue LVar26;
  byte bVar27;
  LibraryValue valueType;
  bool *pbVar28;
  anon_union_2_4_ea848c7b_for_ValueType_13 *regSrc;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar29;
  LabelInstr *local_98;
  LabelInstr *local_90;
  LabelInstr *local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  bool *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_40;
  IRKind local_37;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  LibraryValue local_34;
  undefined1 *puVar13;
  
  local_48 = pNeedHelper;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bce,"(instr)","instr");
    if (!bVar4) goto LAB_005d5d69;
    *puVar11 = 0;
  }
  OVar24 = instr->m_opcode;
  if (((OVar24 - 0x14 < 0x2f) && ((0x600000000003U >> ((ulong)(OVar24 - 0x14) & 0x3f) & 1) != 0)) ||
     (OVar24 - 0x196 < 2)) {
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  IVar1 = instr->m_kind;
  iVar22 = 0;
  switch(OVar24) {
  case BrEq_A:
  case BrSrEq_A:
    goto switchD_005d4d7d_caseD_3b;
  case BrNeq_A:
  case BrSrNeq_A:
    break;
  case BrFalse_A:
  case BrTrue_A:
  case BrGe_A:
  case BrGt_A:
  case BrLt_A:
  case BrLe_A:
    goto switchD_005d4d7d_caseD_3c;
  default:
    switch(OVar24) {
    case CmEq_A:
    case CmSrEq_A:
      goto switchD_005d4d7d_caseD_3b;
    case CmGe_A:
    case CmGt_A:
    case CmLt_A:
    case CmLe_A:
      goto switchD_005d4d7d_caseD_3c;
    case CmNeq_A:
    case CmSrNeq_A:
      goto switchD_005d4d7d_caseD_40;
    default:
      switch(OVar24) {
      case BrNotEq_A:
      case BrSrNotEq_A:
        goto switchD_005d4d7d_caseD_40;
      case BrNotNeq_A:
      case BrSrNotNeq_A:
        goto switchD_005d4d7d_caseD_3b;
      }
    }
    goto switchD_005d4dae_default;
  }
switchD_005d4d7d_caseD_40:
  iVar22 = 1;
switchD_005d4d7d_caseD_3b:
  paVar25 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src1;
  paVar29 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src2;
  local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)this;
  if (paVar25 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0 ||
      paVar29 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bfe,"(src1 && src2)","src1 && src2");
    if (!bVar4) goto LAB_005d5d69;
    *puVar11 = 0;
  }
  else {
    if (IVar1 == InstrKindBranch) {
      local_90 = (LabelInstr *)instr[1].m_next;
      local_80 = IR::Instr::GetOrCreateContinueLabel(instr,isInHelper);
    }
    else {
      local_80 = (LabelInstr *)0x0;
      local_90 = (LabelInstr *)0x0;
    }
    *local_48 = true;
    pLVar12 = IR::Instr::GetOrCreateContinueLabel(instr,isInHelper);
    local_36 = paVar25[4];
    bVar5 = ValueType::IsLikelyBoolean((ValueType *)&local_36.field_0);
    if (bVar5) {
      local_62 = paVar29[4];
      bVar5 = ValueType::IsLikelyTaggedInt((ValueType *)&local_62.field_0);
      regSrc = paVar25;
      if (!bVar5) goto LAB_005d4eaf;
LAB_005d4ee1:
      OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0);
      OVar7 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0);
      local_60 = paVar29;
      if (OVar6 == OpndKindIntConst) {
        if (OVar7 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar5) goto LAB_005d5d69;
          *puVar11 = 0;
        }
        puVar13 = *(undefined1 **)(paVar29 + 8);
        if (puVar13 == (undefined1 *)0x0) {
LAB_005d5167:
          uVar21 = (undefined7)((ulong)puVar13 >> 8);
          local_34 = (LibraryValue)CONCAT71(uVar21,1);
          local_58 = (LabelInstr *)((ulong)local_58._4_4_ << 0x20);
          local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,(int)CONCAT71(uVar21,1));
        }
        else if (puVar13 == &DAT_00000001) {
LAB_005d4f85:
          uVar21 = (undefined7)((ulong)puVar13 >> 8);
          local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,(int)CONCAT71(uVar21,1));
          local_58 = (LabelInstr *)CONCAT44(local_58._4_4_,(int)CONCAT71(uVar21,1));
          local_34 = (LibraryValue)CONCAT71(uVar21,1);
        }
        else {
LAB_005d5152:
          local_34 = (LibraryValue)CONCAT71((int7)((ulong)puVar13 >> 8),1);
          local_50 = (LabelInstr *)((ulong)local_50._4_4_ << 0x20);
          local_58 = (LabelInstr *)((ulong)local_58._4_4_ << 0x20);
        }
LAB_005d5178:
        local_37 = IVar1;
        OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
        OVar7 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
        paVar25 = local_60;
        if (OVar6 == OpndKindIntConst) {
          if (OVar7 != OpndKindIntConst) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
            if (!bVar5) goto LAB_005d5d69;
            *puVar11 = 0;
          }
          bVar5 = *(long *)(regSrc + 8) == 0;
LAB_005d51f7:
          bVar5 = !bVar5;
          bVar3 = true;
LAB_005d51fd:
          local_36 = local_60[4];
          bVar8 = ValueType::IsTaggedInt((ValueType *)&local_36.field_0);
          if (bVar8) {
            local_62 = regSrc[4];
            paVar25 = &local_62;
            bVar8 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
            if (!bVar8) goto LAB_005d52ea;
            *local_48 = false;
            local_98 = (LabelInstr *)0x0;
          }
          else {
LAB_005d52ea:
            local_98 = IR::LabelInstr::New(Label,*(Func **)local_40,true);
            paVar25 = local_60;
            OVar6 = IR::Opnd::GetKind((Opnd *)&local_60->field_0);
            if (((((OVar6 != OpndKindIntConst) &&
                  (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar25->field_0), OVar6 != OpndKindInt64Const
                  )) && (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar25->field_0), OVar6 != OpndKindAddr
                        )) &&
                ((OVar6 = IR::Opnd::GetKind((Opnd *)&paVar25->field_0), OVar6 != OpndKindHelperCall
                 && (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar25->field_0),
                    OVar6 != OpndKindFloatConst)))) &&
               (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar25->field_0), OVar6 != OpndKindSimd128Const)
               ) {
              local_36 = local_60[4];
              bVar8 = ValueType::IsTaggedInt((ValueType *)&local_36.field_0);
              if (!bVar8) {
                OVar6 = IR::Opnd::GetKind((Opnd *)&local_60->field_0);
                if (OVar6 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar11 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar8) goto LAB_005d5d69;
                  *puVar11 = 0;
                }
                LowererMD::GenerateSmIntTest
                          ((LowererMD *)&local_40[4].field_0,(Opnd *)&local_60->field_0,instr,
                           local_98,(Instr **)0x0,false);
              }
            }
            paVar25 = regSrc;
            OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
            if (((OVar6 != OpndKindIntConst) &&
                (paVar25 = regSrc, OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0),
                OVar6 != OpndKindInt64Const)) &&
               ((paVar25 = regSrc, OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0),
                OVar6 != OpndKindAddr &&
                (((paVar25 = regSrc, OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0),
                  OVar6 != OpndKindHelperCall &&
                  (paVar25 = regSrc, OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0),
                  OVar6 != OpndKindFloatConst)) &&
                 (paVar25 = regSrc, OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0),
                 OVar6 != OpndKindSimd128Const)))))) {
              local_36 = regSrc[4];
              paVar25 = &local_36;
              bVar8 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
              if (!bVar8) {
                local_36 = regSrc[4];
                bVar8 = ValueType::IsObject((ValueType *)&local_36.field_0);
                if (!bVar8) {
                  paVar25 = local_40 + 4;
                  pRVar16 = IR::Opnd::AsRegOpnd((Opnd *)&regSrc->field_0);
                  LowererMD::GenerateObjectTest
                            ((LowererMD *)&paVar25->field_0,&pRVar16->super_Opnd,instr,local_98,
                             false);
                }
                OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
                if (OVar6 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar11 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar8) goto LAB_005d5d69;
                  *puVar11 = 0;
                }
                paVar25 = local_40;
                GenerateJSBooleanTest
                          ((Lowerer *)&local_40->field_0,(RegOpnd *)&regSrc->field_0,instr,local_98,
                           false);
              }
            }
          }
          paVar29 = local_40;
          pbVar28 = local_48;
          LVar26 = ValueFalse - iVar22;
          bVar27 = (byte)iVar22;
          pLVar20 = local_80;
          pLVar19 = local_90;
          if (bVar27 != 0) {
            pLVar20 = local_90;
            pLVar19 = local_80;
          }
          if (bVar4) {
            if (local_37 != InstrKindBranch) {
              pOVar18 = instr->m_dst;
              valueType = LVar26;
LAB_005d5671:
              pOVar15 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,valueType);
              InsertMove(pOVar18,pOVar15,instr,true);
              pFVar23 = *(Func **)paVar29;
              local_80 = pLVar12;
              goto LAB_005d569a;
            }
            pBVar14 = IR::BranchInstr::New(JMP,pLVar20,*(Func **)local_40);
            pLVar12 = pLVar19;
          }
          else {
            valueType = iVar22 + ValueTrue;
            if ((undefined1)local_34 == '\0') {
              if (bVar3) {
                if (local_37 == InstrKindBranch) {
                  paVar25 = local_40 + 4;
                  pRVar16 = IR::Opnd::AsRegOpnd((Opnd *)&local_60->field_0);
                  pLVar12 = pLVar19;
                  if (bVar5 != false) {
                    pLVar12 = pLVar20;
                  }
                  LowererMD::GenerateTaggedZeroTest
                            ((LowererMD *)&paVar25->field_0,&pRVar16->super_Opnd,instr,pLVar12);
                  pLVar12 = pLVar20;
                  if (bVar5 != false) {
                    pIVar17 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
                    paVar25 = local_60;
                    pRVar16 = IR::Opnd::AsRegOpnd((Opnd *)&local_60->field_0);
                    InsertCompareBranch((Lowerer *)&paVar25->field_0,&pIVar17->super_Opnd,
                                        &pRVar16->super_Opnd,BrNeq_A,false,pLVar20,instr,true);
                    pLVar12 = pLVar19;
                  }
                  pFVar23 = *(Func **)local_40;
                  pbVar28 = local_48;
                  OVar24 = JMP;
LAB_005d5d1a:
                  pBVar14 = IR::BranchInstr::New(OVar24,pLVar12,pFVar23);
                  IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                  goto LAB_005d5d2a;
                }
                local_34 = LVar26;
                pLVar19 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
                pLVar20 = IR::LabelInstr::New(Label,*(Func **)paVar29,false);
                paVar25 = local_60;
                pRVar16 = IR::Opnd::AsRegOpnd((Opnd *)&local_60->field_0);
                LowererMD::GenerateTaggedZeroTest
                          ((LowererMD *)&paVar29[4].field_0,&pRVar16->super_Opnd,instr,pLVar20);
                LVar26 = local_34;
                if (bVar5 != false) {
                  pIVar17 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
                  pRVar16 = IR::Opnd::AsRegOpnd((Opnd *)&paVar25->field_0);
                  InsertCompareBranch((Lowerer *)&paVar25->field_0,&pIVar17->super_Opnd,
                                      &pRVar16->super_Opnd,BrNeq_A,false,pLVar20,instr,true);
                  LVar26 = valueType;
                  valueType = local_34;
                }
                IR::Instr::InsertBefore(instr,&pLVar19->super_Instr);
                paVar25 = local_40;
                pOVar18 = instr->m_dst;
                pOVar15 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar26);
                InsertMove(pOVar18,pOVar15,instr,true);
                pBVar14 = IR::BranchInstr::New(JMP,pLVar12,*(Func **)paVar25);
                IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                IR::Instr::InsertBefore(instr,&pLVar20->super_Instr);
                pOVar18 = instr->m_dst;
                pOVar15 = LoadLibraryValueOpnd((Lowerer *)&paVar25->field_0,instr,valueType);
                InsertMove(pOVar18,pOVar15,instr,true);
                pFVar23 = *(Func **)paVar25;
                local_80 = pLVar12;
              }
              else {
                local_58 = pLVar20;
                local_34 = LVar26;
                pLVar19 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
                local_50 = IR::LabelInstr::New(Label,*(Func **)paVar29,false);
                OVar6 = IR::Opnd::GetKind((Opnd *)&local_60->field_0);
                if (OVar6 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar11 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar4) goto LAB_005d5d69;
                  *puVar11 = 0;
                }
                this_00 = (char *)local_60;
                LowererMD::GenerateTaggedZeroTest
                          ((LowererMD *)&paVar29[4].field_0,(Opnd *)&local_60->field_0,instr,pLVar19
                          );
                pIVar17 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)paVar29,true);
                OVar6 = IR::Opnd::GetKind((Opnd *)this_00);
                if (OVar6 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar11 = 1;
                  this_00 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                  ;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar4) {
LAB_005d5d69:
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  *puVar11 = 0;
                }
                IVar1 = local_37;
                pLVar20 = local_58;
                if (local_37 != InstrKindBranch) {
                  pLVar20 = local_50;
                }
                InsertCompareBranch((Lowerer *)this_00,&pIVar17->super_Opnd,
                                    (Opnd *)&local_60->field_0,BrNeq_A,false,pLVar20,instr,true);
                if (IVar1 != InstrKindBranch) {
                  if (bVar27 == 0) {
                    InsertMove(instr->m_dst,(Opnd *)&regSrc->field_0,instr,true);
                  }
                  else {
                    GenerateBooleanNegate
                              ((Lowerer *)this_00,instr,(Opnd *)&regSrc->field_0,instr->m_dst);
                  }
                  pbVar28 = local_48;
                  pBVar14 = IR::BranchInstr::New(JMP,pLVar12,*(Func **)paVar29);
                  IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                  this_01 = (Lowerer *)instr;
                  IR::Instr::InsertBefore(instr,&pLVar19->super_Instr);
                  if (bVar27 == 0) {
                    GenerateBooleanNegate(this_01,instr,(Opnd *)&regSrc->field_0,instr->m_dst);
                  }
                  else {
                    InsertMove(instr->m_dst,(Opnd *)&regSrc->field_0,instr,true);
                  }
                  local_48 = (bool *)CONCAT44(local_48._4_4_,0x426);
                  pBVar14 = IR::BranchInstr::New(JMP,pLVar12,*(Func **)paVar29);
                  IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                  IR::Instr::InsertBefore(instr,&local_50->super_Instr);
                  pOVar18 = instr->m_dst;
                  pOVar15 = LoadLibraryValueOpnd((Lowerer *)&paVar29->field_0,instr,local_34);
                  InsertMove(pOVar18,pOVar15,instr,true);
                  pFVar23 = *(Func **)paVar29;
                  OVar24 = (OpCode)local_48;
                  goto LAB_005d5d1a;
                }
                paVar25 = paVar29;
                pOVar18 = LoadLibraryValueOpnd((Lowerer *)&paVar29->field_0,instr,ValueTrue);
                InsertCompareBranch((Lowerer *)&paVar25->field_0,(Opnd *)&regSrc->field_0,pOVar18,
                                    instr->m_opcode,false,local_90,instr,false);
                pBVar14 = IR::BranchInstr::New(JMP,local_80,*(Func **)paVar29);
                IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                IR::Instr::InsertBefore(instr,&pLVar19->super_Instr);
                paVar25 = paVar29;
                pOVar18 = LoadLibraryValueOpnd((Lowerer *)&paVar29->field_0,instr,ValueFalse);
                InsertCompareBranch((Lowerer *)&paVar25->field_0,(Opnd *)&regSrc->field_0,pOVar18,
                                    instr->m_opcode,false,local_90,instr,false);
                pFVar23 = *(Func **)paVar29;
              }
LAB_005d569a:
              pBVar14 = IR::BranchInstr::New(JMP,local_80,pFVar23);
              IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
              pbVar28 = local_48;
              goto LAB_005d5d2a;
            }
            if (!bVar3) {
              if (local_37 == InstrKindBranch) {
                if ((char)local_50 == '\0') {
                  pBVar14 = IR::BranchInstr::New(JMP,pLVar20,*(Func **)local_40);
                  IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
                  pLVar19->field_0x78 = pLVar19->field_0x78 | 0x20;
                  goto LAB_005d5d2a;
                }
                paVar25 = local_40;
                pOVar18 = LoadLibraryValueOpnd
                                    ((Lowerer *)&local_40->field_0,instr,ValueFalse - (byte)local_58
                                    );
                InsertCompareBranch((Lowerer *)&paVar25->field_0,(Opnd *)&regSrc->field_0,pOVar18,
                                    instr->m_opcode,false,local_90,instr,false);
                pFVar23 = *(Func **)paVar29;
                pLVar12 = local_80;
                OVar24 = JMP;
              }
              else if ((char)local_50 == '\0') {
                pOVar18 = instr->m_dst;
                pOVar15 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar26);
                InsertMove(pOVar18,pOVar15,instr,true);
                pFVar23 = *(Func **)paVar29;
                OVar24 = JMP;
              }
              else {
                if (bVar27 == (byte)local_58) {
                  GenerateBooleanNegate
                            ((Lowerer *)&paVar25->field_0,instr,(Opnd *)&regSrc->field_0,
                             instr->m_dst);
                }
                else {
                  InsertMove(instr->m_dst,(Opnd *)&regSrc->field_0,instr,true);
                }
                pFVar23 = *(Func **)local_40;
                OVar24 = JMP;
              }
              goto LAB_005d5d1a;
            }
            if (local_37 != InstrKindBranch) {
              if ((char)local_50 == '\0') {
                valueType = LVar26;
              }
              pOVar18 = instr->m_dst;
              if ((bool)(byte)local_58 != bVar5) {
                valueType = LVar26;
              }
              goto LAB_005d5671;
            }
            pLVar12 = pLVar20;
            if ((char)local_50 != '\x01' || (bool)(byte)local_58 != bVar5) {
              pLVar12 = pLVar19;
              pLVar19 = pLVar20;
            }
            pBVar14 = IR::BranchInstr::New(JMP,pLVar19,*(Func **)local_40);
          }
          IR::Instr::InsertBefore(instr,&pBVar14->super_Instr);
          pLVar12->field_0x78 = pLVar12->field_0x78 | 0x20;
          pbVar28 = local_48;
LAB_005d5d2a:
          if (*pbVar28 != true) {
            return true;
          }
          IR::Instr::InsertBefore(instr,&local_98->super_Instr);
          return true;
        }
        if (OVar7 == OpndKindAddr) {
          OVar6 = IR::Opnd::GetKind((Opnd *)&local_60->field_0);
          if (OVar6 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar5) goto LAB_005d5d69;
            *puVar11 = 0;
          }
          if (((*(char *)((long)paVar25 + 0x29) == '\n') ||
              (*(char *)((long)paVar25 + 0x29) == '\x01')) &&
             (bVar5 = Js::TaggedInt::Is(*(Var *)(paVar25 + 0x10)), bVar5)) {
            iVar10 = Js::TaggedInt::ToInt32(*(Var *)(paVar25 + 0x10));
            bVar5 = iVar10 == 0;
            goto LAB_005d51f7;
          }
        }
        else {
          OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
          if ((((OVar6 != OpndKindIntConst) &&
               (OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0), OVar6 != OpndKindInt64Const))
              && (OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0), OVar6 != OpndKindAddr)) &&
             ((OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0), OVar6 != OpndKindHelperCall &&
              (OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0), OVar6 != OpndKindFloatConst))))
          {
            OVar6 = IR::Opnd::GetKind((Opnd *)&regSrc->field_0);
            bVar5 = false;
            bVar3 = false;
            if (OVar6 == OpndKindSimd128Const) {
              return false;
            }
            goto LAB_005d51fd;
          }
        }
      }
      else {
        OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0);
        if (OVar7 == OpndKindAddr) {
          if (OVar6 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar5) goto LAB_005d5d69;
            *puVar11 = 0;
          }
          if ((*(char *)((long)paVar29 + 0x29) == '\n') ||
             (*(char *)((long)paVar29 + 0x29) == '\x01')) {
            aValue = *(Var *)(paVar29 + 0x10);
            if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000)
              goto switchD_005d4dae_default;
            }
            else {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar11 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                                 ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                 "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar5) goto LAB_005d5d69;
              *puVar11 = 0;
              aValue = *(Var *)(paVar29 + 0x10);
            }
            uVar9 = Js::TaggedInt::ToInt32(aValue);
            puVar13 = (undefined1 *)(ulong)uVar9;
            if (uVar9 != 0) {
              if (uVar9 != 1) goto LAB_005d5152;
              goto LAB_005d4f85;
            }
            goto LAB_005d5167;
          }
        }
        else if (OVar6 != OpndKindIntConst) {
          OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0);
          if (((OVar6 != OpndKindInt64Const) &&
              (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0), OVar6 != OpndKindAddr)) &&
             ((OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0), OVar6 != OpndKindHelperCall &&
              (OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0), OVar6 != OpndKindFloatConst))))
          {
            OVar6 = IR::Opnd::GetKind((Opnd *)&paVar29->field_0);
            local_50 = (LabelInstr *)((ulong)local_50._4_4_ << 0x20);
            local_58 = (LabelInstr *)((ulong)local_58._4_4_ << 0x20);
            local_34 = ValueInvalid;
            if (OVar6 == OpndKindSimd128Const) {
              return false;
            }
            goto LAB_005d5178;
          }
        }
      }
    }
    else {
LAB_005d4eaf:
      local_36 = paVar25[4];
      bVar5 = ValueType::IsLikelyTaggedInt((ValueType *)&local_36.field_0);
      if (bVar5) {
        local_62 = paVar29[4];
        bVar5 = ValueType::IsLikelyBoolean((ValueType *)&local_62.field_0);
        regSrc = paVar29;
        paVar29 = paVar25;
        if (bVar5) goto LAB_005d4ee1;
      }
    }
  }
switchD_005d4dae_default:
switchD_005d4d7d_caseD_3c:
  return false;
}

Assistant:

bool Lowerer::GenerateFastEqBoolInt(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    Assert(instr);

    // There's a total of 8 modes for this function, based on these inferred flags
    bool isBranchNotCompare = instr->IsBranchInstr();
    bool isStrict = false;
    bool isNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
        break;
    default:
        break;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
        isNegOp = false;
        break;
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    default:
        // This opcode is not one of the ones that should be handled here.
        return false;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    // The instrucions given to this _should_ all be 2-arg.
    Assert(src1 && src2);
    if (!(src1 && src2))
    {
        return false;
    }

    // If it's a branch instruction, we'll want these to be defined
    //IR::BranchInstr *instrBranch = nullptr;
    IR::LabelInstr *targetInstr = nullptr;
    IR::LabelInstr *labelFallthrough = nullptr;

    if (isBranchNotCompare)
    {
        IR::BranchInstr * instrBranch = instr->AsBranchInstr();
        targetInstr = instrBranch->GetTarget();
        labelFallthrough = instrBranch->GetOrCreateContinueLabel(isInHelper);
    }

    // Assume we need the helper until we can show otherwise.
    *pNeedHelper = true;
    // If we don't know the final types well enough at JIT time, a helper block to set
    // the inputs to the correct types will be needed.
    IR::LabelInstr *labelHelper = nullptr;
    // If we're doing a compare and can handle it early, then we want to skip the helper
    IR::LabelInstr *labelDone = instr->GetOrCreateContinueLabel(isInHelper);

    // Normallize for orderings
    IR::Opnd *srcBool = nullptr;
    IR::Opnd *srcInt = nullptr;
    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyTaggedInt())
    {
        srcBool = src1;
        srcInt = src2;
    }
    else if (src1->GetValueType().IsLikelyTaggedInt() && src2->GetValueType().IsLikelyBoolean())
    {
        srcInt = src1;
        srcBool = src2;
    }
    else
    {
        return false;
    }

    // If either instruction is constant, we can simplify the check. If both are constant, we can eliminate it
    bool srcIntConst = false;
    bool srcIntConstVal = false;
    // If we're comparing with a number that is not 0 or 1, then the two are inequal by default
    bool srcIntIsBoolable = false;
    bool srcBoolConst = false;
    bool srcBoolConstVal = false;
    if (srcInt->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcInt = srcInt->AsIntConstOpnd();
        IntConstType constIntVal = constSrcInt->GetValue();
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcInt = srcInt->AsAddrOpnd();
        if (!(addrSrcInt && addrSrcInt->IsVar() && Js::TaggedInt::Is(addrSrcInt->m_address)))
        {
            return false;
        }
        int32 constIntVal = Js::TaggedInt::ToInt32(addrSrcInt->m_address);
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }
    if (srcBool->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcBool = srcBool->AsIntConstOpnd();
        IntConstType constIntVal = constSrcBool->GetValue();
        srcBoolConst = true;
        srcBoolConstVal = constIntVal != 0;
    }
    else if (srcBool->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcBool = srcInt->AsAddrOpnd();
        if (!(addrSrcBool && addrSrcBool->IsVar() && Js::TaggedInt::Is(addrSrcBool->m_address)))
        {
            return false;
        }
        int32 value = Js::TaggedInt::ToInt32(addrSrcBool->m_address);
        srcBoolConst = true;
        srcBoolConstVal = value != 0;
    }
    else if (srcBool->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }

    // Do these checks here, since that way we avoid emitting instructions before exiting earlier
    if (srcInt->GetValueType().IsTaggedInt() && srcBool->GetValueType().IsBoolean()) {
        // ok, we know the types, so no helper needed
        *pNeedHelper = false;
    }
    else
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        // check the types and jump to the helper if incorrect
        if (!srcInt->IsConstOpnd() && !srcInt->GetValueType().IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(srcInt->AsRegOpnd(), instr, labelHelper);
        }
        if (!srcBool->IsConstOpnd() && !srcBool->GetValueType().IsBoolean())
        {
            if (!srcBool->GetValueType().IsObject())
            {
                this->m_lowererMD.GenerateObjectTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
            }
            GenerateJSBooleanTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
        }
    }

    // At this point, we know both which operand is an integer and which is a boolean,
    // whether either operand is constant, and what the constant true/false values are
    // for any constant operands. This should allow us to emit some decent code.

    LibraryValue equalResultValue = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue inequalResultValue = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    IR::LabelInstr *equalResultTarget = !isNegOp ? targetInstr : labelFallthrough;
    IR::LabelInstr *inequalResultTarget = !isNegOp ? labelFallthrough : targetInstr;

    // For the Sr instructions, we now know that the types are different, so we can immediately
    // decide what the result will be.
    if (isStrict)
    {
        if (isBranchNotCompare)
        {
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            equalResultTarget->m_noHelperAssert = true;
#endif
        }
        else
        {
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    // Now that we've checked the types, we can lower some instructions to quickly do the check
    // in the case that it's not a type-strict strict equality/inequality check.
    else if (srcIntConst && srcBoolConst)
    {
        // If both arguments are constant, we can statically determine the result.
        bool sameVal = srcIntConstVal == srcBoolConstVal;
        if (isBranchNotCompare)
        {
            // For constant branches, branch to the target
            Assert(instr);
            IR::LabelInstr * target = sameVal && srcIntIsBoolable ? equalResultTarget : inequalResultTarget;
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, target, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            (sameVal && srcIntIsBoolable ? inequalResultTarget : equalResultTarget)->m_noHelperAssert = true;
#endif
        }
        else
        {
            // For constant compares, load the constant result
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, sameVal && srcIntIsBoolable ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (!srcIntConst && !srcBoolConst)
    {
        // If neither is constant, we can still do a bit better than loading the helper
        IR::LabelInstr * firstFalse = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr * forceInequal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        // We branch based on the zero-ness of the integer argument to two checks against the boolean argument
        this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, firstFalse);
        // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
        // case the two will compare as inequal
        InsertCompareBranch(
            IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func, true),
            srcInt->AsRegOpnd(),
            Js::OpCode::BrNeq_A,
            isBranchNotCompare ? inequalResultTarget : forceInequal, // in the case of branching, we can go straight to the inequal target; for compares, we need to load the value
            instr,
            true);
        if (isBranchNotCompare)
        {
            // if the int evaluates to 1 (true)
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));

            // if the int evaluates to 0 (false)
            instr->InsertBefore(firstFalse);
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
        }
        else
        {
            // the int resolves to 1 (true)
            // Load either the bool or its complement into the dst reg, depending on the opcode
            if (isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to 0 (false)
            // Handle the complement case
            instr->InsertBefore(firstFalse);
            if (!isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to something other than 0 or 1 (inequal to a bool)
            instr->InsertBefore(forceInequal);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (srcIntConst)
    {
        if (isBranchNotCompare)
        {
            if (srcIntIsBoolable)
            {
                LibraryValue intval = srcIntConstVal ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
                InsertCompareBranch(
                    srcBool,
                    LoadLibraryValueOpnd(instr, intval),
                    instr->m_opcode,
                    targetInstr,
                    instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
            }
            else
            {
                // Since a constant int that isn't 0 or 1 will always be inequal to bools, just jump to the inequal result
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
                // Since we're not making a non-helper path to one of the branches, we need to tell
                // DbCheckPostLower that we are going to have a non-helper label without non-helper
                // branches.
                // Note: this following line isn't good practice in general
                equalResultTarget->m_noHelperAssert = true;
#endif
            }
        }
        else
        {
            if (srcIntIsBoolable)
            {
                bool directPassthrough = isNegOp != srcIntConstVal;
                if (directPassthrough)
                {
                    // If this case is hit, the result value is the same as the value in srcBool
                    this->InsertMove(instr->GetDst(), srcBool, instr);
                }
                else
                {
                    // Otherwise, the result value is the negation of the value in srcBool
                    GenerateBooleanNegate(instr, srcBool, instr->GetDst());
                }
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
            else
            {
                Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
        }
    }
    else if (srcBoolConst)
    {
        if (isBranchNotCompare)
        {
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, srcBoolConstVal ? inequalResultTarget : equalResultTarget);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, inequalResultTarget, instr, true);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, srcBoolConstVal ? equalResultTarget : inequalResultTarget, this->m_func));
        }
        else
        {
            IR::LabelInstr* isNonZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            IR::LabelInstr* isZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, isZero);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, isZero, instr, true);
            }
            instr->InsertBefore(isNonZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            instr->InsertBefore(isZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, !srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    if (*pNeedHelper)
    {
        instr->InsertBefore(labelHelper);
    }
    return true;
}